

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall higan::FileForRead::~FileForRead(FileForRead *this)

{
  if (this->read_fd_ != -1) {
    close(this->read_fd_);
  }
  Buffer::~Buffer(&this->cache_buffer_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FileForRead::~FileForRead()
{
	if (read_fd_ != -1)
	{
		close(read_fd_);
	}
}